

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zSuperJrnl)

{
  int *piVar1;
  BtShared *pBVar2;
  BtShared *pBt;
  Pager *pPager;
  sqlite3 *psVar3;
  u8 *puVar4;
  uint uVar5;
  Pgno nFin;
  BtCursor *pBVar6;
  int iVar7;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  uint nOrig;
  ulong uVar11;
  Btree **ppBVar12;
  bool bVar13;
  
  if (p->inTrans != '\x02') {
    return 0;
  }
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if (pBVar2->autoVacuum != '\0') {
    pBt = p->pBt;
    pPager = pBt->pPager;
    for (pBVar6 = pBt->pCursor; pBVar6 != (BtCursor *)0x0; pBVar6 = pBVar6->pNext) {
      pBVar6->curFlags = pBVar6->curFlags & 0xfb;
    }
    iVar7 = 0;
    if (pBt->incrVacuum == '\0') {
      nOrig = pBt->nPage;
      uVar5 = 0;
      if (1 < nOrig) {
        iVar7 = (nOrig - 2) - (nOrig - 2) % (pBt->usableSize / 5 + 1);
        uVar5 = iVar7 + (uint)(iVar7 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
      }
      if ((uVar5 == nOrig) || (nOrig == (uint)sqlite3PendingByte / pBt->pageSize + 1)) {
        uVar8 = 0x124d5;
      }
      else {
        uVar5 = *(uint *)(pBt->pPage1->aData + 0x24);
        uVar9 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        psVar3 = p->db;
        uVar5 = uVar9;
        if (psVar3->xAutovacPages != (_func_uint_void_ptr_char_ptr_u32_u32_u32 *)0x0) {
          uVar5 = psVar3->nDb;
          iVar7 = 0;
          if ((int)uVar5 < 1) {
            uVar10 = 0;
          }
          else {
            ppBVar12 = &psVar3->aDb->pBt;
            uVar11 = 0;
            do {
              uVar10 = uVar11;
              if (*ppBVar12 == p) break;
              uVar11 = uVar11 + 1;
              ppBVar12 = ppBVar12 + 4;
              uVar10 = (ulong)uVar5;
            } while (uVar5 != uVar11);
            uVar10 = uVar10 & 0xffffffff;
          }
          uVar5 = (*psVar3->xAutovacPages)
                            (psVar3->pAutovacPagesArg,psVar3->aDb[uVar10].zDbSName,nOrig,uVar9,
                             pBt->pageSize);
          if (uVar9 <= uVar5) {
            uVar5 = uVar9;
          }
          if (uVar5 == 0) goto LAB_00124400;
        }
        nFin = finalDbSize(pBt,nOrig,uVar5);
        if (nFin <= nOrig) {
          iVar7 = 0;
          if ((nFin < nOrig) && (pBt->pCursor != (BtCursor *)0x0)) {
            iVar7 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
          }
          bVar13 = iVar7 == 0;
          if (nFin < nOrig && bVar13) {
            do {
              iVar7 = incrVacuumStep(pBt,nFin,nOrig,(uint)(uVar5 == uVar9));
              nOrig = nOrig - 1;
              bVar13 = iVar7 == 0;
              if (nOrig <= nFin) break;
            } while (iVar7 == 0);
          }
          if ((!(bool)(iVar7 != 0x65 & (bVar13 ^ 1U))) && (uVar9 != 0)) {
            iVar7 = sqlite3PagerWrite(pBt->pPage1->pDbPage);
            if (uVar5 == uVar9) {
              puVar4 = pBt->pPage1->aData;
              puVar4[0x20] = '\0';
              puVar4[0x21] = '\0';
              puVar4[0x22] = '\0';
              puVar4[0x23] = '\0';
              puVar4 = pBt->pPage1->aData;
              puVar4[0x24] = '\0';
              puVar4[0x25] = '\0';
              puVar4[0x26] = '\0';
              puVar4[0x27] = '\0';
            }
            *(Pgno *)(pBt->pPage1->aData + 0x1c) =
                 nFin >> 0x18 | (nFin & 0xff0000) >> 8 | (nFin & 0xff00) << 8 | nFin << 0x18;
            pBt->bDoTruncate = '\x01';
            pBt->nPage = nFin;
          }
          if (iVar7 != 0) {
            sqlite3PagerRollback(pPager);
          }
          goto LAB_00124400;
        }
        uVar8 = 0x124f0;
      }
      iVar7 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar8,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    }
LAB_00124400:
    if (iVar7 != 0) goto LAB_00124426;
  }
  if (pBVar2->bDoTruncate != '\0') {
    pBVar2->pPager->dbSize = pBVar2->nPage;
  }
  iVar7 = sqlite3PagerCommitPhaseOne(pBVar2->pPager,zSuperJrnl,0);
LAB_00124426:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zSuperJrnl){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(p);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zSuperJrnl, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}